

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

void __thiscall cashew::JSPrinter::printTry(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  emit(this,"try ");
  pRVar1 = Ref::operator[]((Ref *)&this_local,1);
  printBlock(this,pRVar1->inst);
  emit(this," catch (");
  pRVar1 = Ref::operator[]((Ref *)&this_local,2);
  printName(this,pRVar1->inst);
  emit(this,") ");
  pRVar1 = Ref::operator[]((Ref *)&this_local,3);
  printBlock(this,pRVar1->inst);
  return;
}

Assistant:

void printTry(Ref node) {
    emit("try ");
    printBlock(node[1]);
    emit(" catch (");
    printName(node[2]);
    emit(") ");
    printBlock(node[3]);
  }